

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O0

ulong BN_div_word(BIGNUM *a,ulong w)

{
  ulong l_00;
  int iVar1;
  ulong d_00;
  ulong uVar2;
  byte bVar3;
  unsigned_long d;
  unsigned_long l;
  int j;
  int i;
  unsigned_long ret;
  int local_24;
  ulong local_20;
  ulong local_8;
  
  local_20 = 0;
  if (w == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else if (a->top == 0) {
    local_8 = 0;
  }
  else {
    iVar1 = BN_num_bits_word(w);
    bVar3 = (byte)(0x40 - iVar1);
    d_00 = w << (bVar3 & 0x3f);
    iVar1 = BN_lshift(a,a,0x40 - iVar1);
    if (iVar1 == 0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      local_24 = a->top;
      while (local_24 = local_24 + -1, -1 < local_24) {
        l_00 = a->d[local_24];
        uVar2 = bn_div_words(local_20,l_00,d_00);
        local_20 = l_00 - uVar2 * d_00;
        a->d[local_24] = uVar2;
      }
      if ((0 < a->top) && (a->d[a->top + -1] == 0)) {
        a->top = a->top + -1;
      }
      local_8 = local_20 >> (bVar3 & 0x3f);
    }
  }
  return local_8;
}

Assistant:

BN_ULONG BN_div_word(BIGNUM *a, BN_ULONG w)
{
    BN_ULONG ret = 0;
    int i, j;

    bn_check_top(a);
    w &= BN_MASK2;

    if (!w)
        /* actually this an error (division by zero) */
        return (BN_ULONG)-1;
    if (a->top == 0)
        return 0;

    /* normalize input (so bn_div_words doesn't complain) */
    j = BN_BITS2 - BN_num_bits_word(w);
    w <<= j;
    if (!BN_lshift(a, a, j))
        return (BN_ULONG)-1;

    for (i = a->top - 1; i >= 0; i--) {
        BN_ULONG l, d;

        l = a->d[i];
        d = bn_div_words(ret, l, w);
        ret = (l - ((d * w) & BN_MASK2)) & BN_MASK2;
        a->d[i] = d;
    }
    if ((a->top > 0) && (a->d[a->top - 1] == 0))
        a->top--;
    ret >>= j;
    bn_check_top(a);
    return (ret);
}